

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.h
# Opt level: O3

bool __thiscall
ami_nvar_t::nvar_entry_body_t::_is_null_extended_header_hash(nvar_entry_body_t *this)

{
  string local_30;
  
  extended_header_hash_abi_cxx11_(&local_30,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return this->n_extended_header_hash;
}

Assistant:

bool _is_null_extended_header_hash() { extended_header_hash(); return n_extended_header_hash; }